

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLKinematicsSceneCreator.cpp
# Opt level: O2

void __thiscall
COLLADASaxFWL::KinematicsSceneCreator::KinematicsSceneCreator
          (KinematicsSceneCreator *this,DocumentProcessor *documentProcessor)

{
  _Rb_tree_header *p_Var1;
  
  this->_vptr_KinematicsSceneCreator = (_func_int **)&PTR__KinematicsSceneCreator_00957c88;
  this->mKinematicsScene = (KinematicsScene *)0x0;
  this->mDocumentProcessor = documentProcessor;
  this->mKinematicsIntermediateData = documentProcessor->mKinematicsIntermediateData;
  this->mLargestLinkNumber = 0;
  std::stack<unsigned_long,std::deque<unsigned_long,std::allocator<unsigned_long>>>::
  stack<std::deque<unsigned_long,std::allocator<unsigned_long>>,void>(&this->mLinkNumberStack);
  this->mLargestJointIndex = 0;
  p_Var1 = &(this->mJointIndexMap)._M_t._M_impl.super__Rb_tree_header;
  (this->mJointIndexMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->mJointIndexMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->mJointIndexMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->mJointIndexMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->mJointIndexMap)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->mOriginalClonedJointPrimitiveMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
       _S_red;
  (this->mOriginalClonedJointPrimitiveMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  p_Var1 = &(this->mOriginalClonedJointPrimitiveMap)._M_t._M_impl.super__Rb_tree_header;
  (this->mOriginalClonedJointPrimitiveMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->mOriginalClonedJointPrimitiveMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->mOriginalClonedJointPrimitiveMap)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  COLLADABU::hash_map<COLLADASaxFWL::KinematicsModel_*,_COLLADAFW::KinematicsModel_*>::hash_map
            (&this->mKinematicsModelFWKinematicsModelMap);
  p_Var1 = &(this->mNodeLinkBindingSet)._M_t._M_impl.super__Rb_tree_header;
  (this->mNodeLinkBindingSet)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->mNodeLinkBindingSet)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->mNodeLinkBindingSet)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->mNodeLinkBindingSet)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->mNodeLinkBindingSet)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  return;
}

Assistant:

KinematicsSceneCreator::KinematicsSceneCreator( DocumentProcessor* documentProcessor )
		: mKinematicsScene(0)
		, mDocumentProcessor(documentProcessor)
		, mKinematicsIntermediateData( documentProcessor->getKinematicsIntermediateData())
		, mLargestLinkNumber(0)
		, mLargestJointIndex(0)
	{

	}